

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_2d5e26::mock_region_factory::init(mock_region_factory *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t bytes_to_map;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> builder;
  shared_ptr<pstore::file::in_memory> local_58;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> local_48;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  local_28;
  
  local_58.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(ctx + 0x18);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 0x20);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  bytes_to_map = (local_58.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->eof_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_00;
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  region_builder(&local_48,&local_58,*(uint64_t *)(ctx + 8),*(uint64_t *)(ctx + 0x10));
  if (local_58.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_factory)._vptr_factory = (_func_int **)0x0;
  (this->super_factory).full_size_ = 0;
  (this->super_factory).min_size_ = 0;
  local_28.ptr_ =
       (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
        *)this;
  pstore::gsl::
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  ::ensure_invariant(&local_28);
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  append(&local_48,local_28,0,bytes_to_map);
  if (local_48.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (int)this;
}

Assistant:

auto init () -> std::vector<pstore::region::memory_mapper_ptr> override {
            return this->create<pstore::file::in_memory, mock_mapper> (file_);
        }